

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGStructurizer::find_selection_merges(CFGStructurizer *this,uint pass)

{
  FILE *__stream;
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  reference ppCVar4;
  size_type sVar5;
  Vector<CFGNode_*> *this_00;
  CFGNode *pCVar6;
  LoggingCallback p_Var7;
  void *pvVar8;
  char *pcVar9;
  bool local_20f2;
  bool local_20f1;
  char local_20e8 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  CFGNode *selection_idom;
  CFGNode *loop;
  char local_10c8 [7];
  bool force_loop;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  CFGNode *merge_candidate_1;
  CFGNode *helper_pred;
  CFGNode *break_target;
  bool merged_into_terminating_path;
  CFGNode *pCStack_98;
  bool post_dominator_is_exit_node;
  CFGNode *merge_candidate;
  CFGNode *inner_loop_header;
  CFGNode *header;
  iterator __end2;
  iterator __begin2;
  Vector<CFGNode_*> *__range2;
  CFGNode **local_60;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_58;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_50;
  CFGNode *local_48;
  CFGNode *inner_header;
  CFGNode *idom;
  CFGNode *node;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  uint pass_local;
  CFGStructurizer *this_local;
  
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&this->forward_post_visit_order);
  node = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&this->forward_post_visit_order);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&node);
    if (!bVar2) {
      return;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    idom = *ppCVar4;
    uVar3 = CFGNode::num_forward_preds(idom);
    if ((1 < uVar3) && (bVar2 = block_is_plain_continue(idom), !bVar2)) {
      inner_header = idom->immediate_dominator;
      sVar5 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&inner_header->succ);
      if (sVar5 < 2) {
        __assert_fail("idom->succ.size() >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x12fb,"void dxil_spv::CFGStructurizer::find_selection_merges(unsigned int)")
        ;
      }
      local_48 = CFGNode::get_outer_selection_dominator(idom);
      if ((local_48 == (CFGNode *)0x0) || ((local_48->ir).terminator.type != Switch)) {
LAB_0019aecc:
        this_00 = &idom->headers;
        __end2 = std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 begin(this_00);
        header = (CFGNode *)
                 std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 end(this_00);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                           *)&header), bVar2) {
          ppCVar4 = __gnu_cxx::
                    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    ::operator*(&__end2);
          inner_loop_header = *ppCVar4;
          if (inner_header->forward_post_visit_order < inner_loop_header->forward_post_visit_order)
          {
            inner_header = inner_loop_header;
          }
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
          ::operator++(&__end2);
        }
        if (((inner_header->pred_back_edge == (CFGNode *)0x0) &&
            (merge_candidate = get_innermost_loop_header_for(this,inner_header),
            merge_candidate != (CFGNode *)0x0)) && (merge_candidate->loop_ladder_block == idom)) {
          inner_header = merge_candidate;
        }
        if (pass == 0) {
          pCStack_98 = CFGNode::find_common_post_dominator(inner_header,idom);
          local_20f1 = false;
          if (pCStack_98 != (CFGNode *)0x0) {
            local_20f1 = pCStack_98->immediate_post_dominator == pCStack_98;
          }
          break_target._7_1_ = local_20f1;
          local_20f2 = false;
          if (local_20f1 != false) {
            local_20f2 = CFGNode::dominates_all_reachable_exits(idom);
          }
          break_target._6_1_ = local_20f2;
          if ((local_20f2 != false) &&
             (bVar2 = CFGNode::post_dominates(inner_header,this->entry_block), bVar2)) {
            break_target._6_1_ = 0;
          }
          if ((((break_target._6_1_ & 1) != 0) &&
              (helper_pred = find_break_target_for_selection_construct(this,inner_header,idom),
              helper_pred != (CFGNode *)0x0)) &&
             ((bVar2 = CFGNode::dominates(inner_header,helper_pred), bVar2 &&
              (bVar2 = std::
                       vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ::empty(&helper_pred->headers), bVar2)))) {
            merge_candidate_1 = create_helper_pred_block(this,inner_header);
            merge_candidate_1->merge = Loop;
            merge_candidate_1->loop_merge_block = helper_pred;
            merge_candidate_1->freeze_structured_analysis = true;
            std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            push_back(&helper_pred->headers,&merge_candidate_1);
          }
        }
        if ((inner_header->merge == None) || (inner_header->merge == Selection)) {
          if ((inner_header->ir).terminator.type != Switch) {
            if (inner_header->merge == Selection) {
              if (pass == 0) {
                if (inner_header->selection_merge_block == (CFGNode *)0x0) {
                  __assert_fail("idom->selection_merge_block",
                                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                                ,0x1351,
                                "void dxil_spv::CFGStructurizer::find_selection_merges(unsigned int)"
                               );
                }
                pCVar6 = CFGNode::find_common_post_dominator
                                   (inner_header->selection_merge_block,inner_header);
                if ((pCVar6 == (CFGNode *)0x0) || (pCVar6 == inner_header->selection_merge_block)) {
                  inner_header->loop_merge_block = inner_header->selection_merge_block;
                }
                else {
                  inner_header->loop_ladder_block = inner_header->selection_merge_block;
                  inner_header->loop_merge_block = pCVar6;
                }
                CFGNode::add_unique_header(inner_header->loop_merge_block,inner_header);
                inner_header->merge = Loop;
                inner_header->selection_merge_block = (CFGNode *)0x0;
                inner_header->freeze_structured_analysis = true;
                inner_header = create_helper_succ_block(this,inner_header);
              }
              else {
                p_Var7 = get_thread_log_callback();
                if (p_Var7 == (LoggingCallback)0x0) {
                  fprintf(_stderr,"[WARN]: Mismatch headers in pass 1 ... ?\n");
                  fflush(_stderr);
                }
                else {
                  snprintf(local_10c8,0x1000,"Mismatch headers in pass 1 ... ?\n");
                  pvVar8 = get_thread_log_callback_userdata();
                  (*p_Var7)(pvVar8,Warn,local_10c8);
                }
              }
            }
            bVar2 = false;
            if (pass == 1) {
              uVar3 = CFGNode::num_forward_preds(idom);
              bVar2 = false;
              if (2 < uVar3) {
                bVar2 = inner_header->merge == None;
              }
            }
            if (bVar2) {
              inner_header->merge = Loop;
              CFGNode::add_unique_header(idom,inner_header);
              inner_header->loop_merge_block = idom;
              inner_header->freeze_structured_analysis = true;
            }
            else {
              inner_header->merge = Selection;
              CFGNode::add_unique_header(idom,inner_header);
              if (idom == (CFGNode *)0x0) {
                __assert_fail("node",
                              "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                              ,0x1383,
                              "void dxil_spv::CFGStructurizer::find_selection_merges(unsigned int)")
                ;
              }
              inner_header->selection_merge_block = idom;
            }
          }
        }
        else if (inner_header->merge == Loop) {
          if ((inner_header->loop_merge_block == idom) &&
             (inner_header->loop_ladder_block != (CFGNode *)0x0)) {
            pCVar6 = create_helper_pred_block(this,inner_header);
            pCVar6->merge = Loop;
            pCVar6->loop_merge_block = idom;
            pCVar6->freeze_structured_analysis = true;
            CFGNode::add_unique_header(idom,pCVar6);
          }
          else if ((inner_header->loop_merge_block != idom) &&
                  (inner_header->loop_ladder_block != idom)) {
            pCVar6 = create_helper_succ_block(this,inner_header);
            pCVar6->merge = Selection;
            pCVar6->selection_merge_block = idom;
            CFGNode::add_unique_header(idom,pCVar6);
          }
        }
        else {
          buffer_1._4088_8_ = get_thread_log_callback();
          pCVar6 = idom;
          __stream = _stderr;
          if ((LoggingCallback)buffer_1._4088_8_ == (LoggingCallback)0x0) {
            pcVar9 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     ::c_str(&idom->name);
            fprintf(__stream,"[WARN]: Cannot merge execution for node %p (%s).\n",pCVar6,pcVar9);
            fflush(_stderr);
          }
          else {
            pcVar9 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     ::c_str(&idom->name);
            snprintf(local_20e8,0x1000,"Cannot merge execution for node %p (%s).\n",pCVar6,pcVar9);
            uVar1 = buffer_1._4088_8_;
            pvVar8 = get_thread_log_callback_userdata();
            (*(code *)uVar1)(pvVar8,1,local_20e8);
          }
        }
      }
      else if (local_48->selection_merge_block != idom) {
        local_58._M_current =
             (CFGNode **)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&local_48->succ);
        local_60 = (CFGNode **)
                   std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::end(&local_48->succ);
        local_50 = std::
                   find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode*>
                             (local_58,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                        )local_60,&idom);
        __range2 = (Vector<CFGNode_*> *)
                   std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::end(&local_48->succ);
        bVar2 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                            *)&__range2);
        if (!bVar2) goto LAB_0019aecc;
      }
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void CFGStructurizer::find_selection_merges(unsigned pass)
{
	for (auto *node : forward_post_visit_order)
	{
		if (node->num_forward_preds() <= 1)
			continue;

		// Never merge to continue block.
		// We should never hit this path unless we explicitly
		// avoided creating a continue ladder block earlier.
		if (block_is_plain_continue(node))
			continue;

		// If there are 2 or more pred edges, try to merge execution.

		// The idom is the natural header block.
		auto *idom = node->immediate_dominator;
		assert(idom->succ.size() >= 2);

		// Check for case fallthrough here. In this case, we do not have a merge scenario, just ignore.
		auto *inner_header = node->get_outer_selection_dominator();
		if (inner_header && inner_header->ir.terminator.type == Terminator::Type::Switch)
		{
			if (inner_header->selection_merge_block == node)
			{
				// We just found a switch block which we have already handled.
				continue;
			}

			if (std::find(inner_header->succ.begin(), inner_header->succ.end(), node) != inner_header->succ.end())
			{
				// Fallthrough.
				continue;
			}
		}

		for (auto *header : node->headers)
		{
			// If we have a loop header already associated with this block, treat that as our idom.
			if (header->forward_post_visit_order > idom->forward_post_visit_order)
				idom = header;
		}

		// Similar, but also check if we have associated ladder blocks with the idom.
		if (!idom->pred_back_edge)
		{
			auto *inner_loop_header = get_innermost_loop_header_for(idom);
			if (inner_loop_header && inner_loop_header->loop_ladder_block == node)
				idom = const_cast<CFGNode *>(inner_loop_header);
		}

		if (pass == 0)
		{
			// Check that we're not merging ourselves into the aether.
			// This is a scenario that can happen if we attempt to merge to a block which terminates the CFG
			// (return or unreachable),
			// but does not post-dominate the idom candidate,
			// i.e. the selection construct needs to break to some other scope.
			// If this happens, we won't be able to register a typical breaking scenario
			// (since post-domination analysis won't help us),
			// and we need to do some magic fixups.

			auto *merge_candidate = CFGNode::find_common_post_dominator(idom, node);
			bool post_dominator_is_exit_node =
				merge_candidate && merge_candidate->immediate_post_dominator == merge_candidate;
			bool merged_into_terminating_path = post_dominator_is_exit_node && node->dominates_all_reachable_exits();

			// If our candidate idom post dominates the entry block, we consider this the main path of execution.
			if (merged_into_terminating_path && idom->post_dominates(entry_block))
				merged_into_terminating_path = false;

			if (merged_into_terminating_path)
			{
				// Similar to loops, find the break target for this construct.
				auto *break_target = find_break_target_for_selection_construct(idom, node);

				// Have not observed any scenario where we won't have a dominated break target we can use.
				if (break_target && idom->dominates(break_target) && break_target->headers.empty())
				{
					// Enclose this scope in a loop.
					auto *helper_pred = create_helper_pred_block(idom);
					helper_pred->merge = MergeType::Loop;
					helper_pred->loop_merge_block = break_target;
					helper_pred->freeze_structured_analysis = true;
					break_target->headers.push_back(helper_pred);
				}
			}
		}

		if (idom->merge == MergeType::None || idom->merge == MergeType::Selection)
		{
			// We just found a switch block which we have already handled.
			if (idom->ir.terminator.type == Terminator::Type::Switch)
				continue;

			// If the idom is already a selection construct, this must mean
			// we have some form of breaking construct inside this inner construct.
			// This fooled find_selection_merges() to think we had a selection merge target at the break target.
			// Fix this up here, where we rewrite the outer construct as a fixed loop instead.
			if (idom->merge == MergeType::Selection)
			{
				if (pass == 0)
				{
					assert(idom->selection_merge_block);

					// If we turn the outer selection construct into a loop,
					// we remove the possibility to break further out (without adding ladders like we do for loops).
					// To make this work, we must ensure that the new merge block post-dominates the loop and selection merge.
					auto *merge_candidate = CFGNode::find_common_post_dominator(idom->selection_merge_block, idom);

					if (!merge_candidate || merge_candidate == idom->selection_merge_block)
					{
						idom->loop_merge_block = idom->selection_merge_block;
					}
					else
					{
						// Make sure we split merge scopes. Pretend we have a true loop.
						idom->loop_ladder_block = idom->selection_merge_block;
						idom->loop_merge_block = merge_candidate;
					}

					idom->loop_merge_block->add_unique_header(idom);

					idom->merge = MergeType::Loop;
					idom->selection_merge_block = nullptr;
					idom->freeze_structured_analysis = true;
					idom = create_helper_succ_block(idom);
				}
				else
					LOGW("Mismatch headers in pass 1 ... ?\n");
			}

			// If we're in a pass 1, opting for a selection merge better make sure that we can
			// actually use this as a merge block.
			// If we have more than 2 preds, there is no way this is not a break block merge.
			// It is not a switch statement and selections spawn two new scopes.
			// We should have resolved this in pass 0, but it can slip through the cracks if there
			// are multiple interleaving merge scopes in play.
			bool force_loop = pass == 1 &&
			                  node->num_forward_preds() > 2 &&
			                  idom->merge == MergeType::None;

			if (force_loop)
			{
				idom->merge = MergeType::Loop;
				node->add_unique_header(idom);
				idom->loop_merge_block = node;
				idom->freeze_structured_analysis = true;
			}
			else
			{
				idom->merge = MergeType::Selection;
				node->add_unique_header(idom);
				assert(node);
				idom->selection_merge_block = node;
				//LOGI("Selection merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(idom), idom->name.c_str(),
				//     static_cast<const void *>(node), node->name.c_str());
			}
		}
		else if (idom->merge == MergeType::Loop)
		{
			if (idom->loop_merge_block == node && idom->loop_ladder_block)
			{
				// We need to create an outer shell for this header since we need to ladder break to this node.
				auto *loop = create_helper_pred_block(idom);
				loop->merge = MergeType::Loop;
				loop->loop_merge_block = node;
				loop->freeze_structured_analysis = true;
				node->add_unique_header(loop);
				//LOGI("Loop merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(loop), loop->name.c_str(),
				//     static_cast<const void *>(node), node->name.c_str());
			}
			else if (idom->loop_merge_block != node && idom->loop_ladder_block != node)
			{
				auto *selection_idom = create_helper_succ_block(idom);
				// If we split the loop header into the loop header -> selection merge header,
				// then we can merge into a continue block for example.
				selection_idom->merge = MergeType::Selection;
				selection_idom->selection_merge_block = node;
				node->add_unique_header(selection_idom);
				//LOGI("Selection merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(selection_idom),
				//     selection_idom->name.c_str(), static_cast<const void *>(node), node->name.c_str());
			}
		}
		else
		{
			// We are hosed. There is no obvious way to merge execution here.
			// This might be okay.
			LOGW("Cannot merge execution for node %p (%s).\n", static_cast<const void *>(node), node->name.c_str());
		}
	}
}